

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::XmlWriter::writeEncodedText(XmlWriter *this,string *text)

{
  char cVar1;
  pointer pcVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  char *local_78;
  long local_70;
  char local_68 [16];
  size_type *local_58;
  string mtext;
  
  local_58 = &mtext._M_string_length;
  pcVar2 = (text->_M_dataplus)._M_p;
  mtext.field_2._8_8_ = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + text->_M_string_length);
  pcVar5 = writeEncodedText::charsToEncode;
  strlen(writeEncodedText::charsToEncode);
  lVar4 = std::__cxx11::string::find_first_of((char *)&local_58,(ulong)pcVar5,0);
  if (lVar4 != -1) {
    do {
      poVar3 = *(ostream **)(mtext.field_2._8_8_ + 0x40);
      std::__cxx11::string::substr((ulong)&local_78,(ulong)&local_58);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_78,local_70);
      if (local_78 != local_68) {
        operator_delete(local_78);
      }
      cVar1 = *(char *)((long)local_58 + lVar4);
      if (cVar1 == '\"') {
        lVar4 = 6;
        pcVar5 = "&quot;";
LAB_0014fb82:
        std::__ostream_insert<char,std::char_traits<char>>
                  (*(ostream **)(mtext.field_2._8_8_ + 0x40),pcVar5,lVar4);
      }
      else {
        if (cVar1 == '&') {
          lVar4 = 5;
          pcVar5 = "&amp;";
          goto LAB_0014fb82;
        }
        if (cVar1 == '<') {
          lVar4 = 4;
          pcVar5 = "&lt;";
          goto LAB_0014fb82;
        }
      }
      std::__cxx11::string::substr((ulong)&local_78,(ulong)&local_58);
      std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
      if (local_78 != local_68) {
        operator_delete(local_78);
      }
      pcVar5 = writeEncodedText::charsToEncode;
      strlen(writeEncodedText::charsToEncode);
      lVar4 = std::__cxx11::string::find_first_of((char *)&local_58,(ulong)pcVar5,0);
    } while (lVar4 != -1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (*(ostream **)(mtext.field_2._8_8_ + 0x40),(char *)local_58,(long)mtext._M_dataplus._M_p
            );
  if (local_58 != &mtext._M_string_length) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

void writeEncodedText( std::string const& text ) {
            static const char* charsToEncode = "<&\"";
            std::string mtext = text;
            std::string::size_type pos = mtext.find_first_of( charsToEncode );
            while( pos != std::string::npos ) {
                stream() << mtext.substr( 0, pos );

                switch( mtext[pos] ) {
                    case '<':
                        stream() << "&lt;";
                        break;
                    case '&':
                        stream() << "&amp;";
                        break;
                    case '\"':
                        stream() << "&quot;";
                        break;
                }
                mtext = mtext.substr( pos+1 );
                pos = mtext.find_first_of( charsToEncode );
            }
            stream() << mtext;
        }